

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O2

Index __thiscall
MADPComponentDiscreteObservations::JointToRestrictedJointObservationIndex
          (MADPComponentDiscreteObservations *this,Index joI,Scope *agSc_e)

{
  Index IVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indivIndices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> jo_vec_e;
  allocator_type local_39;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  indivIndices = JointToIndividualObservationIndices(this,joI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,
             (long)(agSc_e->super_SDT).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(agSc_e->super_SDT).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_39);
  IndexTools::RestrictIndividualIndicesToScope<unsigned_int>
            (indivIndices,agSc_e,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
  IVar1 = IndividualToJointObservationIndices
                    (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,agSc_e);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  return IVar1;
}

Assistant:

Index MADPComponentDiscreteObservations::
JointToRestrictedJointObservationIndex(
        Index joI, const Scope& agSc_e ) const
{
    const vector<Index>& jo_vec = JointToIndividualObservationIndices(joI);
    vector<Index> jo_vec_e(agSc_e.size());
    IndexTools::RestrictIndividualIndicesToScope(jo_vec, agSc_e, jo_vec_e);
    Index jo_e = IndividualToJointObservationIndices(jo_vec_e, agSc_e);
    return(jo_e);

}